

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tidy.c
# Opt level: O2

void printXMLOption(TidyDoc tdoc,TidyOption topt,OptionDesc *d)

{
  FILE *__stream;
  TidyConfigCategory TVar1;
  int iVar2;
  ctmbstr ptVar3;
  TidyOption topt_00;
  size_t __n;
  tmbstr ptVar4;
  ctmbstr ptVar5;
  bool bVar6;
  CmdOptDesc *pos_2;
  CmdOptDesc *pCVar7;
  char *pcVar8;
  TidyIterator pos;
  CmdOptDesc localHit;
  
  TVar1 = tidyOptGetCategory(topt);
  if (TVar1 != TidyInternalCategory) {
    printf(" <option class=\"%s\">\n",d->cat);
    printf("  <name>%s</name>\n",d->name);
    printf("  <type>%s</type>\n",d->type);
    if (d->def == (ctmbstr)0x0) {
      puts("  <default />");
    }
    else {
      printf("  <default>%s</default>\n");
    }
    if (d->haveVals == no) {
      pcVar8 = "  <example />";
    }
    else {
      printf("  <example>");
      if (d->vals == (ctmbstr)0x0) {
        pos = tidyOptGetPickList(topt);
        bVar6 = false;
        while (pos != (TidyIterator)0x0) {
          if (bVar6) {
            printf(", ");
          }
          ptVar3 = tidyOptGetNextPick(topt,&pos);
          printf(anon_var_dwarf_19f52 + 0x16,ptVar3);
          bVar6 = true;
        }
      }
      else {
        printf(anon_var_dwarf_19f52 + 0x16);
      }
      pcVar8 = "</example>";
    }
    puts(pcVar8);
    ptVar3 = tidyOptGetDoc(tdoc,topt);
    if (ptVar3 == (ctmbstr)0x0) {
      puts("  <description />");
      __stream = _stderr;
      ptVar3 = tidyLocalizedString(0x344);
      ptVar5 = tidyOptGetName(topt);
      fprintf(__stream,ptVar3,ptVar5);
      fputc(10,_stderr);
    }
    else {
      printf("  <description>%s</description>\n",ptVar3);
    }
    pos = tidyOptGetDocLinksList(tdoc,topt);
    while (pos != (TidyIterator)0x0) {
      topt_00 = tidyOptGetNextDocLinks(tdoc,&pos);
      ptVar3 = tidyOptGetName(topt_00);
      printf("  <seealso>%s</seealso>\n",ptVar3);
    }
    for (pCVar7 = cmdopt_defs; pCVar7->name1 != (ctmbstr)0x0; pCVar7 = pCVar7 + 1) {
      ptVar3 = tidyOptGetName(topt);
      snprintf((char *)&pos,0x32,"%s:",ptVar3);
      pcVar8 = pCVar7->eqconfig;
      if (pcVar8 != (char *)0x0) {
        __n = strlen((char *)&pos);
        iVar2 = strncmp((char *)&pos,pcVar8,__n);
        if (iVar2 == 0) {
          localHit.cat = pCVar7->cat;
          localHit._4_4_ = *(undefined4 *)&pCVar7->field_0x4;
          localHit.name1 = pCVar7->name1;
          localHit.key = pCVar7->key;
          localHit.subKey = pCVar7->subKey;
          localHit.eqconfig = pCVar7->eqconfig;
          localHit.name2 = pCVar7->name2;
          localHit.name3 = pCVar7->name3;
          localize_option_names(&localHit);
          ptVar3 = localHit.name1;
          ptVar4 = get_escaped_name(localHit.name1);
          printf("  <eqconsole>%s</eqconsole>\n",ptVar4);
          free(ptVar3);
          free(ptVar4);
          ptVar3 = localHit.name2;
          if (localHit.name2 != (ctmbstr)0x0) {
            ptVar4 = get_escaped_name(localHit.name2);
            printf("  <eqconsole>%s</eqconsole>\n",ptVar4);
            free(ptVar3);
            free(ptVar4);
          }
          ptVar3 = localHit.name3;
          if (localHit.name3 != (ctmbstr)0x0) {
            ptVar4 = get_escaped_name(localHit.name3);
            printf("  <eqconsole>%s</eqconsole>\n",ptVar4);
            free(ptVar3);
            free(ptVar4);
          }
          free(localHit.eqconfig);
          goto LAB_00132b8c;
        }
      }
    }
    printf("  %s\n","  <eqconsole />");
LAB_00132b8c:
    puts(" </option>");
  }
  return;
}

Assistant:

static void printXMLOption(TidyDoc tdoc,    /**< The Tidy document. */
                           TidyOption topt, /**< The option. */
                           OptionDesc *d    /**< The OptionDesc for the option. */
                           )
{
    if ( tidyOptGetCategory(topt) == TidyInternalCategory )
        return;

    printf( " <option class=\"%s\">\n", d->cat );
    printf  ("  <name>%s</name>\n",d->name);
    printf  ("  <type>%s</type>\n",d->type);
    if (d->def)
        printf("  <default>%s</default>\n",d->def);
    else
        printf("  <default />\n");
    if (d->haveVals)
    {
        printf("  <example>");
        PrintAllowedValues( topt, d );
        printf("</example>\n");
    }
    else
    {
        printf("  <example />\n");
    }
    printXMLDescription( tdoc, topt );
    printXMLCrossRef( tdoc, topt );
    printXMLCrossRefEqConsole( tdoc, topt );
    printf( " </option>\n" );
}